

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O3

int Cudd_zddNextPath(DdGen *gen,int **path)

{
  DdManager *pDVar1;
  DdNode **ppDVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  
  iVar4 = (gen->stack).sp;
  if (iVar4 != 1) {
    pDVar1 = gen->manager;
    ppDVar2 = (gen->stack).stack;
    do {
      pDVar7 = *(DdNode **)((uint *)((ulong)ppDVar2[(long)iVar4 + -2] & 0xfffffffffffffffe) + 4);
      piVar3 = (gen->gen).cubes.cube;
      uVar5 = *(uint *)((ulong)ppDVar2[(long)iVar4 + -2] & 0xfffffffffffffffe);
      if (pDVar7 != ppDVar2[(long)iVar4 + -1]) {
        piVar3[uVar5] = 1;
        uVar6 = (ulong)(gen->stack).sp;
        ppDVar2[uVar6 - 1] = pDVar7;
        do {
          while( true ) {
            ppDVar2 = (gen->stack).stack;
            pDVar7 = ppDVar2[(long)(int)uVar6 + -1];
            pDVar8 = (DdNode *)((ulong)pDVar7 & 0xfffffffffffffffe);
            if ((ulong)pDVar8->index == 0x7fffffff) break;
            (gen->gen).cubes.cube[pDVar8->index] = 0;
            iVar4 = (gen->stack).sp;
            ppDVar2[iVar4] = (DdNode *)((ulong)(pDVar8->type).kids.E ^ 1);
            uVar5 = iVar4 + 1;
            uVar6 = (ulong)uVar5;
            (gen->stack).sp = uVar5;
          }
          if (pDVar1->zero != pDVar8) {
            gen->status = 1;
            (gen->gen).cubes.value = (pDVar8->type).value;
            *path = (gen->gen).cubes.cube;
            return 1;
          }
          while( true ) {
            if ((int)uVar6 == 1) goto LAB_0092a911;
            pDVar8 = *(DdNode **)
                      ((uint *)((ulong)ppDVar2[(long)(int)uVar6 + -2] & 0xfffffffffffffffe) + 4);
            piVar3 = (gen->gen).cubes.cube;
            uVar5 = *(uint *)((ulong)ppDVar2[(long)(int)uVar6 + -2] & 0xfffffffffffffffe);
            if (pDVar8 != pDVar7) break;
            piVar3[uVar5] = 2;
            iVar4 = (gen->stack).sp;
            uVar5 = iVar4 - 1;
            uVar6 = (ulong)uVar5;
            (gen->stack).sp = uVar5;
            pDVar7 = ppDVar2[(long)iVar4 + -2];
          }
          piVar3[uVar5] = 1;
          uVar6 = (ulong)(gen->stack).sp;
          ppDVar2[uVar6 - 1] = pDVar8;
        } while( true );
      }
      piVar3[uVar5] = 2;
      iVar4 = (gen->stack).sp + -1;
      (gen->stack).sp = iVar4;
    } while (iVar4 != 1);
  }
LAB_0092a911:
  gen->status = 0;
  (gen->stack).sp = 0;
  return 0;
}

Assistant:

int
Cudd_zddNextPath(
  DdGen * gen,
  int ** path)
{
    DdNode *top, *next, *prev;
    DdManager *zdd = gen->manager;

    /* Backtrack from previously reached terminal node. */
    while (1) {
        if (gen->stack.sp == 1) {
            /* The current node has no predecessor. */
            gen->status = CUDD_GEN_EMPTY;
            gen->stack.sp--;
            goto done;
        }
        top = gen->stack.stack[gen->stack.sp-1];
        prev = Cudd_Regular(gen->stack.stack[gen->stack.sp-2]);
        next = cuddT(prev);
        if (next != top) { /* follow the then branch next */
            gen->gen.cubes.cube[prev->index] = 1;
            gen->stack.stack[gen->stack.sp-1] = next;
            break;
        }
        /* Pop the stack and try again. */
        gen->gen.cubes.cube[prev->index] = 2;
        gen->stack.sp--;
    }

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        if (!cuddIsConstant(Cudd_Regular(top))) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[Cudd_Regular(top)->index] = 0;
            next = cuddE(Cudd_Regular(top));
            gen->stack.stack[gen->stack.sp] = Cudd_Not(next); gen->stack.sp++;
        } else if (Cudd_Regular(top) == DD_ZERO(zdd)) {
            /* Backtrack. */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = Cudd_Regular(gen->stack.stack[gen->stack.sp-2]);
                next = cuddT(prev);
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[prev->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[prev->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(Cudd_Regular(top));
            goto done;
        }
    }

done:
    if (gen->status == CUDD_GEN_EMPTY) return(0);
    *path = gen->gen.cubes.cube;
    return(1);

}